

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O2

void __thiscall opengv::absolute_pose::modules::Epnp::solve_for_sign(Epnp *this)

{
  double dVar1;
  undefined8 uVar2;
  uint uVar3;
  double *pdVar4;
  ulong uVar5;
  double (*padVar6) [3];
  int i;
  long lVar7;
  int j;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  pdVar4 = this->pcs;
  if (((pdVar4[2] < 0.0) && (0 < *this->signs)) || ((0.0 < pdVar4[2] && (*this->signs < 0)))) {
    padVar6 = this->ccs;
    for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
      for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
        auVar9._0_8_ = -(*padVar6)[lVar8];
        auVar9._8_8_ = 0x8000000000000000;
        dVar1 = (double)vmovlpd_avx(auVar9);
        (*padVar6)[lVar8] = dVar1;
      }
      padVar6 = padVar6 + 1;
    }
    uVar3 = this->number_of_correspondences;
    for (lVar7 = 0; (ulong)(~((int)uVar3 >> 0x1f) & uVar3) * 0x18 - lVar7 != 0; lVar7 = lVar7 + 0x18
        ) {
      uVar5 = ((ulong *)((long)pdVar4 + lVar7))[1];
      *(ulong *)((long)pdVar4 + lVar7) = *(ulong *)((long)pdVar4 + lVar7) ^ 0x8000000000000000;
      ((ulong *)((long)pdVar4 + lVar7))[1] = uVar5 ^ 0x8000000000000000;
      auVar10._0_8_ = *(ulong *)((long)pdVar4 + lVar7 + 0x10) ^ 0x8000000000000000;
      auVar10._8_8_ = 0x8000000000000000;
      uVar2 = vmovlpd_avx(auVar10);
      *(undefined8 *)((long)pdVar4 + lVar7 + 0x10) = uVar2;
    }
  }
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::solve_for_sign(void)
{
  //change2: the following method is not independent of the optical system
  /*if (pcs[2] < 0.0) {
    for(int i = 0; i < 4; i++)
      for(int j = 0; j < 3; j++)
  ccs[i][j] = -ccs[i][j];

    for(int i = 0; i < number_of_correspondences; i++) {
      pcs[3 * i    ] = -pcs[3 * i];
      pcs[3 * i + 1] = -pcs[3 * i + 1];
      pcs[3 * i + 2] = -pcs[3 * i + 2];
    }
  }*/

  //change to this (using original depths)
  if( (pcs[2] < 0.0 && signs[0] > 0) || (pcs[2] > 0.0 && signs[0] < 0) )
  {
    for(int i = 0; i < 4; i++)
      for(int j = 0; j < 3; j++)
        ccs[i][j] = -ccs[i][j];

    for(int i = 0; i < number_of_correspondences; i++)
    {
      pcs[3 * i    ] = -pcs[3 * i];
      pcs[3 * i + 1] = -pcs[3 * i + 1];
      pcs[3 * i + 2] = -pcs[3 * i + 2];
    }
  }
}